

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cues::AddCue(Cues *this,CuePoint *cue)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  CuePoint **ppCVar4;
  int local_44;
  int local_34;
  int32_t i;
  CuePoint **cues;
  int32_t new_capacity;
  CuePoint *cue_local;
  Cues *this_local;
  
  if (cue == (CuePoint *)0x0) {
    return false;
  }
  if (this->cue_entries_capacity_ < this->cue_entries_size_ + 1) {
    if (this->cue_entries_capacity_ == 0) {
      local_44 = 2;
    }
    else {
      local_44 = this->cue_entries_capacity_ << 1;
    }
    if (local_44 < 1) {
      return false;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_44;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppCVar4 = (CuePoint **)operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (ppCVar4 == (CuePoint **)0x0) {
      return false;
    }
    for (local_34 = 0; local_34 < this->cue_entries_size_; local_34 = local_34 + 1) {
      ppCVar4[local_34] = this->cue_entries_[local_34];
    }
    if (this->cue_entries_ != (CuePoint **)0x0) {
      operator_delete__(this->cue_entries_);
    }
    this->cue_entries_ = ppCVar4;
    this->cue_entries_capacity_ = local_44;
  }
  CuePoint::set_output_block_number(cue,(bool)(this->output_block_number_ & 1));
  iVar1 = this->cue_entries_size_;
  this->cue_entries_size_ = iVar1 + 1;
  this->cue_entries_[iVar1] = cue;
  return true;
}

Assistant:

bool Cues::AddCue(CuePoint* cue) {
  if (!cue)
    return false;

  if ((cue_entries_size_ + 1) > cue_entries_capacity_) {
    // Add more CuePoints.
    const int32_t new_capacity =
        (!cue_entries_capacity_) ? 2 : cue_entries_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    CuePoint** const cues =
        new (std::nothrow) CuePoint*[new_capacity];  // NOLINT
    if (!cues)
      return false;

    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      cues[i] = cue_entries_[i];
    }

    delete[] cue_entries_;

    cue_entries_ = cues;
    cue_entries_capacity_ = new_capacity;
  }

  cue->set_output_block_number(output_block_number_);
  cue_entries_[cue_entries_size_++] = cue;
  return true;
}